

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiID id_00;
  uint *puVar1;
  size_t local_40;
  ImGuiContext_conflict *g;
  ImGuiID id;
  ImGuiID seed;
  char *str_end_local;
  char *str_local;
  ImGuiWindow_conflict *this_local;
  
  puVar1 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)&this->IDStack);
  if (str_end == (char *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = (long)str_end - (long)str;
  }
  id_00 = ImHashStr(str,local_40,*puVar1);
  if (GImGui->DebugHookIdInfo == id_00) {
    ImGui::DebugHookIdInfo(id_00,0xb,str,str_end);
  }
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_String, str, str_end);
    return id;
}